

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O2

iterator_range<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
 __thiscall
burst::algorithm::
bitap<wchar_t,std::bitset<32ul>,std::map<wchar_t,std::bitset<32ul>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,std::bitset<32ul>>>>>
::find_next<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
          (bitap<wchar_t,std::bitset<32ul>,std::map<wchar_t,std::bitset<32ul>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,std::bitset<32ul>>>>>
           *this,__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 previous_match_begin,
          __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          previous_match_end,
          __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          corpus_end,bitmask_type *hint)

{
  _WordT _Var1;
  bitmask_type bVar2;
  iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::random_access_traversal_tag>
  iVar3;
  iterator_range<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  iVar4;
  
  if (previous_match_end._M_current != corpus_end._M_current) {
    _Var1 = (hint->super__Base_bitset<1UL>)._M_w;
    bVar2 = algorithm::detail::
            element_position_bitmask_table<std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>
            ::operator[](*(element_position_bitmask_table<std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>
                           **)this,previous_match_end._M_current);
    (hint->super__Base_bitset<1UL>)._M_w =
         (ulong)((uint)bVar2.super__Base_bitset<1UL>._M_w & (int)_Var1 * 2 + 1U);
    iVar3.
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::incrementable_traversal_tag>
         = (iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::bidirectional_traversal_tag>
            )active_search<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
                       (this,(__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                              )(previous_match_begin._M_current + 1),
                        (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                         )(previous_match_end._M_current + 1),corpus_end,hint);
    return (iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::random_access_traversal_tag>
            )(iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::random_access_traversal_tag>
              )iVar3.
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::incrementable_traversal_tag>
    ;
  }
  iVar4.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = corpus_end._M_current;
  iVar4.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = corpus_end._M_current;
  return (iterator_range<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          )iVar4.
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::incrementable_traversal_tag>
  ;
}

Assistant:

boost::iterator_range<ForwardIterator>
                find_next
                (
                    ForwardIterator previous_match_begin,
                    ForwardIterator previous_match_end,
                    ForwardIterator corpus_end,
                    bitmask_type & hint
                ) const
            {
                if (previous_match_end != corpus_end)
                {
                    hint = bit_shift(hint) & (*m_bitmask_table)[*previous_match_end];
                    ++previous_match_begin;
                    ++previous_match_end;

                    return
                        active_search(previous_match_begin, previous_match_end, corpus_end, hint);
                }
                else
                {
                    return boost::make_iterator_range(corpus_end, corpus_end);
                }
            }